

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fxch.c
# Opt level: O1

void Fxch_CubesUnGruping(Fxch_Man_t *pFxchMan)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  uint uVar3;
  Vec_Wec_t *pVVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  
  if (pFxchMan->vCubes->nSize != pFxchMan->vOutputID->nSize / pFxchMan->nSizeOutputID) {
    __assert_fail("Vec_WecSize( pFxchMan->vCubes ) == ( Vec_IntSize( pFxchMan->vOutputID ) / pFxchMan->nSizeOutputID )"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/Fxch.c"
                  ,0x71,"void Fxch_CubesUnGruping(Fxch_Man_t *)");
  }
  pVVar4 = pFxchMan->vCubes;
  if (0 < pVVar4->nSize) {
    lVar8 = 0;
    do {
      pVVar1 = pVVar4->pArray;
      if (pVVar1[lVar8].nSize != 0) {
        if (pVVar1[lVar8].nSize < 1) {
LAB_004b70ad:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*pVVar1[lVar8].pArray == 0) {
          uVar11 = pFxchMan->nSizeOutputID;
          uVar3 = (int)lVar8 * uVar11;
          if (((int)uVar3 < 0) || (pFxchMan->vOutputID->nSize <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar2 = pFxchMan->vOutputID->pArray;
          if ((int)uVar11 < 1) {
            iVar15 = 0;
          }
          else {
            uVar12 = 0;
            iVar15 = 0;
            do {
              uVar14 = piVar2[uVar11 * (int)lVar8 + uVar12];
              uVar14 = (uVar14 >> 1 & 0x55555555) + (uVar14 & 0x55555555);
              uVar14 = (uVar14 >> 2 & 0x33333333) + (uVar14 & 0x33333333);
              uVar14 = (uVar14 >> 4 & 0x7070707) + (uVar14 & 0x7070707);
              uVar14 = (uVar14 >> 8 & 0xf000f) + (uVar14 & 0xf000f);
              iVar15 = (uVar14 >> 0x10) + iVar15 + (uVar14 & 0xffff);
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
          }
          if ((0 < pFxchMan->nSizeOutputID) && (iVar15 != 0)) {
            lVar9 = 0;
            do {
              uVar11 = (int)lVar9 << 5;
              uVar12 = 0;
              do {
                if (((uint)piVar2[(ulong)uVar3 + lVar9] >> ((uint)uVar12 & 0x1f) & 1) != 0) {
                  if (iVar15 == 1) {
                    if ((int)uVar11 < 0) goto LAB_004b70ad;
                    uVar5 = uVar12 | uVar11;
                    if (pFxchMan->vTranslation->nSize <= (int)uVar5) goto LAB_004b70ad;
                    if (pVVar1[lVar8].nSize < 1) goto LAB_004b70cc;
                    piVar7 = pFxchMan->vTranslation->pArray + uVar5;
                    pVVar6 = pVVar1 + lVar8;
                  }
                  else {
                    pVVar4 = pFxchMan->vCubes;
                    uVar14 = pVVar4->nCap;
                    if (pVVar4->nSize == uVar14) {
                      if ((int)uVar14 < 0x10) {
                        if (pVVar4->pArray == (Vec_Int_t *)0x0) {
                          pVVar6 = (Vec_Int_t *)malloc(0x100);
                        }
                        else {
                          pVVar6 = (Vec_Int_t *)realloc(pVVar4->pArray,0x100);
                        }
                        pVVar4->pArray = pVVar6;
                        iVar10 = 0x10;
                      }
                      else {
                        iVar10 = uVar14 * 2;
                        if (iVar10 <= (int)uVar14) goto LAB_004b6f65;
                        if (pVVar4->pArray == (Vec_Int_t *)0x0) {
                          pVVar6 = (Vec_Int_t *)malloc((ulong)uVar14 << 5);
                        }
                        else {
                          pVVar6 = (Vec_Int_t *)realloc(pVVar4->pArray,(ulong)uVar14 << 5);
                        }
                        pVVar4->pArray = pVVar6;
                      }
                      memset(pVVar6 + pVVar4->nCap,0,((long)iVar10 - (long)pVVar4->nCap) * 0x10);
                      pVVar4->nCap = iVar10;
                    }
LAB_004b6f65:
                    iVar10 = pVVar4->nSize;
                    uVar14 = iVar10 + 1;
                    pVVar4->nSize = uVar14;
                    if (iVar10 < 0) {
                      __assert_fail("p->nSize > 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                                    ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
                    }
                    pVVar6 = pVVar4->pArray;
                    if (0 < pVVar1[lVar8].nSize) {
                      lVar13 = 0;
                      do {
                        Vec_IntPush(pVVar6 + ((ulong)uVar14 - 1),pVVar1[lVar8].pArray[lVar13]);
                        lVar13 = lVar13 + 1;
                      } while (lVar13 < pVVar1[lVar8].nSize);
                    }
                    if ((int)uVar11 < 0) goto LAB_004b70ad;
                    uVar5 = uVar12 | uVar11;
                    if (pFxchMan->vTranslation->nSize <= (int)uVar5) goto LAB_004b70ad;
                    if (pVVar6[(ulong)uVar14 - 1].nSize < 1) {
LAB_004b70cc:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                    }
                    piVar7 = pFxchMan->vTranslation->pArray + uVar5;
                    pVVar6 = pVVar6 + ((ulong)uVar14 - 1);
                  }
                  *pVVar6->pArray = *piVar7;
                  iVar15 = iVar15 + -1;
                }
              } while ((uVar12 < 0x1f) && (uVar12 = uVar12 + 1, iVar15 != 0));
              lVar9 = lVar9 + 1;
            } while ((lVar9 < pFxchMan->nSizeOutputID) && (iVar15 != 0));
          }
        }
      }
      lVar8 = lVar8 + 1;
      pVVar4 = pFxchMan->vCubes;
    } while (lVar8 < pVVar4->nSize);
  }
  pVVar1 = pFxchMan->vTranslation;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = pFxchMan->vOutputID;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  if (pFxchMan->pTempOutputID != (int *)0x0) {
    free(pFxchMan->pTempOutputID);
    pFxchMan->pTempOutputID = (int *)0x0;
  }
  return;
}

Assistant:

void Fxch_CubesUnGruping(Fxch_Man_t* pFxchMan)
{
    int iCube;
    int i, j;
    Vec_Int_t* vCube;
    Vec_Int_t* vNewCube;

    assert( Vec_WecSize( pFxchMan->vCubes ) == ( Vec_IntSize( pFxchMan->vOutputID ) / pFxchMan->nSizeOutputID ) );
    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, iCube )
    {
        int * pOutputID, nOnes;
        if ( Vec_IntSize( vCube ) == 0 || Vec_IntEntry( vCube, 0 ) != 0 )
            continue;

        pOutputID = Vec_IntEntryP( pFxchMan->vOutputID, iCube * pFxchMan->nSizeOutputID );
        nOnes = 0;

        for ( i = 0; i < pFxchMan->nSizeOutputID; i++ )
            nOnes += Fxch_CountOnes( (unsigned int) pOutputID[i] );

        for ( i = 0; i < pFxchMan->nSizeOutputID && nOnes; i++ )
            for ( j = 0; j < 32 && nOnes; j++ )
                if ( pOutputID[i] & ( 1 << j ) )
                {
                    if ( nOnes == 1 )
                        Vec_IntWriteEntry( vCube, 0, Vec_IntEntry( pFxchMan->vTranslation, ( i << 5 ) | j ) );
                    else
                    {
                        vNewCube = Vec_WecPushLevel( pFxchMan->vCubes );
                        Vec_IntAppend( vNewCube, vCube );
                        Vec_IntWriteEntry( vNewCube, 0, Vec_IntEntry( pFxchMan->vTranslation, (i << 5 ) | j ) );
                    }
                    nOnes -= 1;
                }
    }

    Vec_IntFree( pFxchMan->vTranslation );
    Vec_IntFree( pFxchMan->vOutputID );
    ABC_FREE( pFxchMan->pTempOutputID );
    return;
}